

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packer.cpp
# Opt level: O1

void __thiscall CPacker::AddString(CPacker *this,char *pStr,int Limit)

{
  uchar uVar1;
  uchar *puVar2;
  long lVar3;
  
  if (this->m_Error != 0) {
    return;
  }
  if (Limit < 1) {
    do {
      uVar1 = *pStr;
      if (uVar1 == '\0') goto LAB_0013de66;
      pStr = (char *)((uchar *)pStr + 1);
      puVar2 = this->m_pCurrent;
      this->m_pCurrent = puVar2 + 1;
      *puVar2 = uVar1;
    } while (this->m_pCurrent < this->m_pEnd);
  }
  else {
    lVar3 = 0;
    do {
      uVar1 = pStr[lVar3];
      if ((uVar1 == '\0') || (Limit == (int)lVar3)) goto LAB_0013de66;
      puVar2 = this->m_pCurrent;
      this->m_pCurrent = puVar2 + 1;
      *puVar2 = uVar1;
      lVar3 = lVar3 + 1;
    } while (this->m_pCurrent < this->m_pEnd);
  }
  this->m_Error = 1;
LAB_0013de66:
  puVar2 = this->m_pCurrent;
  this->m_pCurrent = puVar2 + 1;
  *puVar2 = '\0';
  return;
}

Assistant:

void CPacker::AddString(const char *pStr, int Limit)
{
	if(m_Error)
		return;

	//
	if(Limit > 0)
	{
		while(*pStr && Limit != 0)
		{
			*m_pCurrent++ = *pStr++;
			Limit--;

			if(m_pCurrent >= m_pEnd)
			{
				m_Error = 1;
				break;
			}
		}
		*m_pCurrent++ = 0;
	}
	else
	{
		while(*pStr)
		{
			*m_pCurrent++ = *pStr++;

			if(m_pCurrent >= m_pEnd)
			{
				m_Error = 1;
				break;
			}
		}
		*m_pCurrent++ = 0;
	}
}